

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OoutReportText.cpp
# Opt level: O0

void __thiscall
oout::OoutReportText::OoutReportText(OoutReportText *this,shared_ptr<const_oout::Result> *result)

{
  shared_ptr<const_oout::Result> *result_local;
  OoutReportText *this_local;
  
  Text::Text(&this->super_Text);
  (this->super_Text)._vptr_Text = (_func_int **)&PTR__OoutReportText_00325af8;
  std::shared_ptr<const_oout::Result>::shared_ptr(&this->result,result);
  return;
}

Assistant:

OoutReportText::OoutReportText(const shared_ptr<const Result> &result)
	: result(result)
{
}